

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test::TestBody
          (CommandLineInterfaceTest_Plugin_SourceFileDescriptors_Test *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar4;
  undefined1 *puVar5;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar6;
  char *in_R9;
  string_view name;
  string_view name_00;
  string_view src;
  string_view data;
  string_view filename;
  string_view contents;
  string_view contents_00;
  AssertHelper local_158;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertHelper local_120;
  string binary_request;
  string base64_output;
  string local_c8;
  CodeGeneratorRequest request;
  string plugin_path;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "syntax = \"proto2\"\n                      ;\n                      import \"bar.proto\";\n                      package foo;\n                      message Foo {\n                        optional bar.Bar b = 1;\n                        extensions 1000 to max [\n                          declaration = {\n                            number: 1000\n                            full_name: \".foo.my_ext\"\n                            type: \".foo.MyType\"\n                          }\n                        ];\n                      }"
  ;
  contents._M_len = 0x202;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "bar.proto";
  name_00._M_len = 9;
  contents_00._M_str =
       "syntax = \"proto2\"\n                      ;\n                      package bar;\n                      message Bar {\n                        extensions 1000 to max [\n                          declaration = {\n                            number: 1000\n                            full_name: \".baz.my_ext\"\n                            type: \".baz.MyType\"\n                          }\n                        ];\n                      }"
  ;
  contents_00._M_len = 0x1a8;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&plugin_path,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/fake_plugin"
             ,(allocator<char> *)&request);
  request.super_Message.super_MessageLite =
       (MessageLite)
       absl::lts_20250127::NullSafeStringView
                 (
                 "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir foo.proto --plugin=prefix-gen-fake_plugin="
                 );
  base64_output._M_dataplus._M_p = (pointer)plugin_path._M_string_length;
  base64_output._M_string_length = (size_type)plugin_path._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_c8,(lts_20250127 *)&request,(AlphaNum *)&base64_output,
             (AlphaNum *)plugin_path._M_string_length);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  filename._M_str = "foo.proto.request";
  filename._M_len = 0x11;
  pcVar6 = "foo.proto.request";
  compiler::(anonymous_namespace)::CommandLineInterfaceTest::ReadFile_abi_cxx11_
            (&base64_output,this,filename);
  binary_request._M_dataplus._M_p = (pointer)&binary_request.field_2;
  binary_request._M_string_length = 0;
  binary_request.field_2._M_local_buf[0] = '\0';
  src._M_str = (char *)&binary_request;
  src._M_len = (size_t)base64_output._M_dataplus._M_p;
  gtest_ar_.success_ =
       absl::lts_20250127::Base64Unescape
                 ((lts_20250127 *)base64_output._M_string_length,src,(Nonnull<std::string_*>)pcVar6)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&request,(internal *)&gtest_ar_,
               (AssertionResult *)"absl::Base64Unescape(base64_output, &binary_request)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x227,(char *)request.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&request);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_007fad49;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  data._M_str = binary_request._M_dataplus._M_p;
  data._M_len = binary_request._M_string_length;
  bVar1 = MessageLite::ParseFromString((MessageLite *)&request,data);
  this_01 = &gtest_ar__1.message_;
  gtest_ar__1.success_ = bVar1;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_01);
    gtest_ar__1._0_4_ =
         request.field_0._impl_.source_file_descriptors_.super_RepeatedPtrFieldBase.current_size_;
    local_158.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_,"request.source_file_descriptors_size()","1",
               (int *)&gtest_ar__1,(int *)&local_158);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar6 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x22d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      this_00 = &request.field_0._impl_.source_file_descriptors_;
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)&gtest_ar_,"request.source_file_descriptors(0).name()","\"foo.proto\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(pVVar2->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                 (char (*) [10])0xe820a6);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar6 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x22e,pcVar6);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      gtest_ar__1._0_4_ = *(undefined4 *)((long)&pVVar2->field_0 + 0x28);
      local_158.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_,"request.source_file_descriptors(0).message_type_size()","1"
                 ,(int *)&gtest_ar__1,(int *)&local_158);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar6 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x22f,pcVar6);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                           (&this_00->super_RepeatedPtrFieldBase,0);
        pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(pVVar2->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,0);
        gtest_ar__1._0_4_ = *(undefined4 *)((long)&pVVar3->field_0 + 0x58);
        local_158.data_._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"m.extension_range_size()","1",(int *)&gtest_ar__1,
                   (int *)&local_158);
        if (gtest_ar_.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          pVVar4 = protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                             (&(pVVar3->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                              0);
          puVar5 = (undefined1 *)(pVVar4->field_0)._impl_.options_;
          if ((ExtensionRangeOptions *)puVar5 == (ExtensionRangeOptions *)0x0) {
            puVar5 = _ExtensionRangeOptions_default_instance_;
          }
          gtest_ar__1._0_4_ =
               *(undefined4 *)((long)&((ExtensionRangeOptions *)puVar5)->field_0 + 0x28);
          local_158.data_._0_4_ = 1;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar_,"m.extension_range(0).options().declaration_size()","1",
                     (int *)&gtest_ar__1,(int *)&local_158);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar__1);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar6 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar6 = *(char **)gtest_ar_.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_158,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                       ,0x232,pcVar6);
            testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper(&local_158);
            if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
            }
          }
          this_01 = &gtest_ar_.message_;
          goto LAB_007fad37;
        }
        testing::Message::Message((Message *)&gtest_ar__1);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar6 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                   ,0x231,pcVar6);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar__1);
      }
    }
    this_01 = &gtest_ar_.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
    }
  }
  else {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"request.ParseFromString(binary_request)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x229,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_158.data_._4_4_,local_158.data_._0_4_) + 8))();
    }
  }
LAB_007fad37:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
LAB_007fad49:
  std::__cxx11::string::~string((string *)&binary_request);
  std::__cxx11::string::~string((string *)&base64_output);
  std::__cxx11::string::~string((string *)&plugin_path);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, Plugin_SourceFileDescriptors) {
  CreateTempFile("foo.proto",
                 R"pb(syntax = "proto2"
                      ;
                      import "bar.proto";
                      package foo;
                      message Foo {
                        optional bar.Bar b = 1;
                        extensions 1000 to max [
                          declaration = {
                            number: 1000
                            full_name: ".foo.my_ext"
                            type: ".foo.MyType"
                          }
                        ];
                      })pb");
  CreateTempFile("bar.proto",
                 R"pb(syntax = "proto2"
                      ;
                      package bar;
                      message Bar {
                        extensions 1000 to max [
                          declaration = {
                            number: 1000
                            full_name: ".baz.my_ext"
                            type: ".baz.MyType"
                          }
                        ];
                      })pb");

#ifdef GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH
  std::string plugin_path = GOOGLE_PROTOBUF_FAKE_PLUGIN_PATH;
#else
  std::string plugin_path = absl::StrCat(
      TestUtil::TestSourceDir(), "/google/protobuf/compiler/fake_plugin");
#endif

  // Invoke protoc with fake_plugin to get ahold of the CodeGeneratorRequest
  // sent by protoc.
  Run(absl::StrCat(
      "protocol_compiler --fake_plugin_out=$tmpdir --proto_path=$tmpdir "
      "foo.proto --plugin=prefix-gen-fake_plugin=",
      plugin_path));
  ExpectNoErrors();
  std::string base64_output = ReadFile("foo.proto.request");
  std::string binary_request;
  ASSERT_TRUE(absl::Base64Unescape(base64_output, &binary_request));
  CodeGeneratorRequest request;
  ASSERT_TRUE(request.ParseFromString(binary_request));

  // request.source_file_descriptors() should consist of a descriptor for
  // foo.proto that includes source-retention options.
  ASSERT_EQ(request.source_file_descriptors_size(), 1);
  EXPECT_EQ(request.source_file_descriptors(0).name(), "foo.proto");
  ASSERT_EQ(request.source_file_descriptors(0).message_type_size(), 1);
  const DescriptorProto& m = request.source_file_descriptors(0).message_type(0);
  ASSERT_EQ(m.extension_range_size(), 1);
  EXPECT_EQ(m.extension_range(0).options().declaration_size(), 1);
}